

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O3

GridNode * __thiscall Grid::get_target_node(Grid *this)

{
  uint uVar1;
  GridNode *pGVar2;
  long lVar3;
  GridNode *pGVar4;
  ulong uVar5;
  
  if ((long)this->rows < 1) {
    return this->nodes;
  }
  uVar1 = this->columns;
  lVar3 = 0;
  pGVar4 = this->nodes;
  do {
    pGVar2 = pGVar4;
    uVar5 = (ulong)uVar1;
    if (0 < (int)uVar1) {
      do {
        if (pGVar2->state == TARGET) {
          return pGVar2;
        }
        pGVar2 = pGVar2 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    lVar3 = lVar3 + 1;
    pGVar4 = pGVar4 + uVar1;
  } while (lVar3 != this->rows);
  return this->nodes;
}

Assistant:

GridNode *get_target_node()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                if (get_node_from_position(x, y)->state == TARGET)
                {
                    return get_node_from_position(x, y);
                }
            }
        }
        return get_node_from_position(0, 0);
    }